

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O2

void opengv::generateMulti2D3DCorrespondences
               (translation_t *position,rotation_t *rotation,translations_t *camOffsets,
               rotations_t *camRotations,size_t pointsPerCam,double noise,double outlierFraction,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiPoints,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiBearingVectors,
               vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
               *gt)

{
  double *pdVar1;
  pointer pMVar2;
  undefined1 auVar3 [16];
  element_type *peVar4;
  Matrix<double,_1,_1,0,_1,_1> *this;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *pvVar5;
  pointer pMVar6;
  size_t i;
  double dVar7;
  long lVar8;
  pointer pMVar9;
  long lVar10;
  long lVar11;
  size_t i_1;
  long lVar12;
  ulong uVar13;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 in_XMM2 [16];
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  bearingVectors;
  size_t pointsPerCam_local;
  shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> gt_sub;
  rotation_t camRotation_1;
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  points;
  rotation_t camRotation;
  point_t bodyPoint;
  Vector3d local_68;
  point_t bodyPoint_1;
  
  uVar13 = 0;
  pointsPerCam_local = pointsPerCam;
  while( true ) {
    pMVar6 = (camOffsets->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pMVar9 = (camOffsets->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)pMVar6 - (long)pMVar9) / 0x18) <= uVar13) break;
    this = (Matrix<double,_1,_1,0,_1,_1> *)Eigen::internal::conditional_aligned_malloc<false>(0x18);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)CONCAT44(camRotation_1.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0]._4_4_,3);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
              (this,(int *)&camRotation_1,&pointsPerCam_local);
    std::__shared_ptr<Eigen::Matrix<double,-1,-1,0,-1,-1>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Eigen::Matrix<double,_1,_1,0,_1,_1>,void>
              ((__shared_ptr<Eigen::Matrix<double,_1,_1,0,_1,_1>,(__gnu_cxx::_Lock_policy)2> *)
               &gt_sub,(Matrix<double,__1,__1,_0,__1,__1> *)this);
    for (dVar7 = 0.0; (ulong)dVar7 < pointsPerCam_local; dVar7 = (double)((long)dVar7 + 1)) {
      generateRandomPoint((Vector3d *)&camRotation,8.0,4.0);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = (double)((gt_sub.
                           super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         ).m_storage.m_rows;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)(((gt_sub.
                            super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_data +
                         (long)camRotation_1.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[1] * (long)dVar7);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = (double)gt_sub.
                         super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = 0.0;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = dVar7;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[1];
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&camRotation_1,
                 (Matrix<double,_3,_1,_0,_3,_1> *)&camRotation);
    }
    std::
    vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
    ::push_back(gt,&gt_sub);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&gt_sub.
                super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    uVar13 = uVar13 + 1;
  }
  for (uVar13 = 0; uVar13 < (ulong)(((long)pMVar6 - (long)pMVar9) / 0x18); uVar13 = uVar13 + 1) {
    pvVar5 = (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)operator_new(0x18);
    (pvVar5->
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pvVar5->
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar5->
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    __shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>,void>
              ((__shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>,(__gnu_cxx::_Lock_policy)2>
                *)&points,pvVar5);
    pvVar5 = (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)operator_new(0x18);
    (pvVar5->
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pvVar5->
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar5->
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    __shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>,void>
              ((__shared_ptr<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>,(__gnu_cxx::_Lock_policy)2>
                *)&bearingVectors,pvVar5);
    lVar10 = 0;
    pMVar9 = (camOffsets->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar13;
    gt_sub.super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = *(element_type **)
              &(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data;
    gt_sub.super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data + 8);
    pMVar2 = (camRotations->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = *(double *)
           ((long)&pMVar2[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data + 0x40);
    pMVar2 = pMVar2 + uVar13;
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = *(double *)
           ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 8);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = *(double *)
           ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x10);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [3] = *(double *)
           ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x18);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [4] = *(double *)
           ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x20);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [5] = *(double *)
           ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x28);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [6] = *(double *)
           ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x30);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [7] = *(double *)
           ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x38);
    for (dVar7 = 0.0;
        peVar4 = points.
                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr, (ulong)dVar7 < pointsPerCam_local; dVar7 = (double)((long)dVar7 + 1)) {
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = *(double *)(*(long *)gt + uVar13 * 0x10);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = *(double *)
                  ((long)camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[3] + 8);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)((long)camRotation_1.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[1] * (long)dVar7 * 8 +
                         *(long *)camRotation_1.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[3]);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = 0.0;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = dVar7;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[1];
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&bodyPoint,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &camRotation_1);
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)peVar4,(Matrix<double,_3,_1,_0,_3,_1> *)&bodyPoint);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = *(double *)(*(long *)gt + uVar13 * 0x10);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = *(double *)
                  ((long)camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[4] + 8);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = (double)((long)camRotation_1.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[2] * (long)dVar7 * 8 +
                         *(long *)camRotation_1.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[4]);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = 0.0;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)rotation;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = dVar7;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[2];
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[8] = (double)position;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&bodyPoint,
                 (DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                  *)&camRotation_1);
      peVar4 = bearingVectors.
               super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)&camRotation;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = (double)&gt_sub;
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = (double)&bodyPoint;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&bodyPoint_1,
                 (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                  *)&camRotation_1);
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)peVar4,(Matrix<double,_3,_1,_0,_3,_1> *)&bodyPoint_1);
      pMVar14 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                ((long)&((((bearingVectors.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data + lVar10);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(pMVar14);
      camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)pMVar14;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 ((long)&((((bearingVectors.
                             super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data + lVar10),
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&camRotation_1);
      if (0.0 < noise) {
        pMVar9 = ((bearingVectors.
                   super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)
                 ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar10);
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = *pdVar1;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = pdVar1[1];
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = *(double *)
               ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar10 + 0x10);
        addNoise((Vector3d *)&camRotation_1,noise,&local_68);
        pMVar9 = ((bearingVectors.
                   super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)
         ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data + lVar10 + 0x10) =
             camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[2];
        pdVar1 = (double *)
                 ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar10);
        *pdVar1 = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[0];
        pdVar1[1] = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[1];
      }
      lVar10 = lVar10 + 0x18;
    }
    std::
    vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
    ::push_back(multiPoints,&points);
    std::
    vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
    ::push_back(multiBearingVectors,&bearingVectors);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bearingVectors.
                super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&points.
                super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    pMVar9 = (camOffsets->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pMVar6 = (camOffsets->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  auVar3 = vcvtusi2sd_avx512f(in_XMM2,pointsPerCam_local);
  uVar13 = 0;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar3._0_8_ * outlierFraction;
  auVar3 = vroundsd_avx(auVar16,auVar16,9);
  lVar10 = vcvttsd2usi_avx512f(auVar3);
  for (; uVar13 < (ulong)(((long)pMVar6 - (long)pMVar9) / 0x18); uVar13 = uVar13 + 1) {
    lVar11 = 0;
    lVar12 = uVar13 * 0x10;
    gt_sub.super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = *(element_type **)
              &pMVar9[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
               .m_data;
    gt_sub.super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          ((long)&pMVar9[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data + 8);
    pMVar2 = (camRotations->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[8] = *(double *)
                ((long)&pMVar2[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data + 0x40);
    pMVar2 = pMVar2 + uVar13;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = *(double *)
                ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 8);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = *(double *)
                ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x10);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[3] = *(double *)
                ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x18);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[4] = *(double *)
                ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x20);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[5] = *(double *)
                ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x28);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[6] = *(double *)
                ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x30);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[7] = *(double *)
                ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x38);
    lVar8 = lVar10;
    while( true ) {
      bVar15 = lVar8 == 0;
      lVar8 = lVar8 + -1;
      if (bVar15) break;
      generateRandomPoint(&bodyPoint,8.0,4.0);
      camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)rotation;
      camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = (double)&bodyPoint;
      camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = (double)position;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&bodyPoint_1,
                 (DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                  *)&camRotation);
      camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)&camRotation_1;
      camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = (double)&gt_sub;
      camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = (double)&bodyPoint_1;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (**(long **)(*(long *)multiBearingVectors + lVar12) + lVar11),
                 (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
                  *)&camRotation);
      pMVar14 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                (**(long **)(*(long *)multiBearingVectors + lVar12) + lVar11);
      camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(pMVar14);
      camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)pMVar14;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (**(long **)(*(long *)multiBearingVectors + lVar12) + lVar11),
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&camRotation);
      lVar11 = lVar11 + 0x18;
    }
    pMVar9 = (camOffsets->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pMVar6 = (camOffsets->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

void
opengv::generateMulti2D3DCorrespondences(
    const translation_t & position,
    const rotation_t & rotation,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t pointsPerCam,
    double noise,
    double outlierFraction,
    std::vector<std::shared_ptr<points_t> > & multiPoints,
    std::vector<std::shared_ptr<bearingVectors_t> > & multiBearingVectors,
    std::vector<std::shared_ptr<Eigen::MatrixXd> > & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    std::shared_ptr<Eigen::MatrixXd> gt_sub(new Eigen::MatrixXd(3,pointsPerCam));
    for( size_t i = 0; i < pointsPerCam; i++ )
      gt_sub->col(i) = generateRandomPoint( maxDepth, minDepth );
    gt.push_back(gt_sub);
  }

  //iterate through the cameras (pairs)
  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    //create the bearing-vector arrays for this camera
    std::shared_ptr<points_t> points(new points_t());
    std::shared_ptr<bearingVectors_t> bearingVectors(new bearingVectors_t());

    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //now iterate through the points of that camera
    for( size_t i = 0; i < (size_t) pointsPerCam; i++ )
    {
      points->push_back(gt[cam]->col(i));

      //project the point into the viewpoint frame
      point_t bodyPoint = rotation.transpose()*(gt[cam]->col(i) - position);

      //project that point into the camera
      bearingVectors->push_back( camRotation.transpose()*(bodyPoint - camOffset) );

      //normalize the vector
      (*bearingVectors)[i] = (*bearingVectors)[i] / (*bearingVectors)[i].norm();

      //add noise
      if( noise > 0.0 )
        (*bearingVectors)[i] = addNoise(noise,(*bearingVectors)[i]);
    }

    //push back the stuff for this camera
    multiPoints.push_back(points);
    multiBearingVectors.push_back(bearingVectors);
  }

  //add outliers
  size_t outliersPerCam = (size_t) floor(outlierFraction*pointsPerCam);

  //iterate through the cameras
  for(size_t cam = 0; cam < camOffsets.size(); cam++)
  {
    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //add outliers
    for(size_t i = 0; i < outliersPerCam; i++)
    {
      //generate a random point
      point_t p = generateRandomPoint(8,4);

      //transform that point into viewpoint 2 only
      point_t bodyPoint = rotation.transpose()*(p - position);

      //use as measurement (outlier)
      (*(multiBearingVectors[cam].get()))[i] =
          camRotation.transpose()*(bodyPoint - camOffset);

      //normalize
      (*(multiBearingVectors[cam].get()))[i] =
          (*(multiBearingVectors[cam].get()))[i] / (*(multiBearingVectors[cam].get()))[i].norm();
    }
  }
}